

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O0

void basisu::scale_image(imagef *src,imagef *dst,vec4F *scale,vec4F *shift)

{
  uint32_t uVar1;
  float *pfVar2;
  imagef *in_RSI;
  float fVar3;
  float fVar4;
  uint32_t c;
  vec4F d;
  vec4F *p;
  uint32_t x;
  int y;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  vec4F *in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  uint local_54;
  vec<4U,_float> local_50;
  vec4F *local_40;
  uint local_38;
  int local_34;
  imagef *local_10;
  
  local_10 = in_RSI;
  vec<4U,_float>::vec(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                      0.0,7.573952e-39);
  imagef::resize((imagef *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (imagef *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (uint32_t)in_stack_ffffffffffffff84,
                 (vec4F *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_34 = 0;
  while( true ) {
    iVar6 = local_34;
    uVar1 = imagef::get_height(local_10);
    if ((int)uVar1 <= iVar6) break;
    local_38 = 0;
    while( true ) {
      uVar5 = local_38;
      uVar1 = imagef::get_width(local_10);
      if (uVar1 <= uVar5) break;
      local_40 = imagef::operator()((imagef *)
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                    (uint32_t)in_stack_ffffffffffffff7c,
                                    (uint32_t)in_stack_ffffffffffffff78);
      vec<4U,_float>::vec(&local_50);
      for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
        in_stack_ffffffffffffff84 =
             vec<4U,_float>::operator[]
                       (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
        fVar3 = vec<4U,_float>::operator[]
                          (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
        fVar3 = in_stack_ffffffffffffff84 * fVar3;
        fVar4 = vec<4U,_float>::operator[]
                          (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
        fVar3 = fVar3 + fVar4;
        pfVar2 = vec<4U,_float>::operator[]
                           (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
        *pfVar2 = fVar3;
      }
      in_stack_ffffffffffffff70 =
           imagef::operator()((imagef *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (uint32_t)in_stack_ffffffffffffff7c,
                              (uint32_t)in_stack_ffffffffffffff78);
      pfVar2 = vec<4U,_float>::operator[]
                         (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
      in_stack_ffffffffffffff78 = *pfVar2;
      pfVar2 = vec<4U,_float>::operator[]
                         (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
      in_stack_ffffffffffffff7c = *pfVar2;
      pfVar2 = vec<4U,_float>::operator[]
                         (in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
      in_stack_ffffffffffffff80 = *pfVar2;
      vec<4U,_float>::operator[](in_stack_ffffffffffffff70,(uint32_t)in_stack_ffffffffffffff6c);
      vec<4U,_float>::set((vec<4U,_float> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          SUB84(in_stack_ffffffffffffff70,0));
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void scale_image(const imagef &src, imagef &dst, const vec4F &scale, const vec4F &shift)
	{
		dst.resize(src);

//#pragma omp parallel for
		for (int y = 0; y < (int)dst.get_height(); y++)
		{
			for (uint32_t x = 0; x < dst.get_width(); x++)
			{
				const vec4F &p = src(x, y);

				vec4F d;

				for (uint32_t c = 0; c < 4; c++)
					d[c] = scale[c] * p[c] + shift[c];

				dst(x, y).set(d[0], d[1], d[2], d[3]);
			}
		}
	}